

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O2

bool __thiscall
duckdb::PartialBlockManager::HasBlockAllocation(PartialBlockManager *this,uint32_t segment_size)

{
  iterator iVar1;
  ulong local_10;
  
  if (this->max_partial_block_size < segment_size) {
    return false;
  }
  local_10 = (ulong)segment_size;
  iVar1 = ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
          ::lower_bound(&(this->partially_filled_blocks)._M_t,&local_10);
  return (_Rb_tree_header *)iVar1._M_node !=
         &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool PartialBlockManager::HasBlockAllocation(uint32_t segment_size) {
	return segment_size <= max_partial_block_size &&
	       partially_filled_blocks.lower_bound(segment_size) != partially_filled_blocks.end();
}